

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool EV_MovePoly(line_t_conflict *line,int polyNum,double speed,DAngle *angle,double dist,
                bool overRide)

{
  DInterpolation *this;
  long lVar1;
  FPolyObj *poly;
  DPolyAction *pDVar2;
  bool bVar3;
  FPolyMirrorIterator it;
  TAngle<double> local_1e8;
  DObject *pDStack_1e0;
  FPolyMirrorIterator local_1d0;
  
  lVar1 = (long)po_NumPolyobjs;
  local_1d0.CurPoly = polyobjs;
  if (0 < lVar1) {
    do {
      if ((local_1d0.CurPoly)->tag == polyNum) {
        local_1d0.NumUsedPolys = 1;
        local_1d0.UsedPolys[0] = polyNum;
        poly = FPolyMirrorIterator::NextMirror(&local_1d0);
        if (poly == (FPolyObj *)0x0) {
          return false;
        }
        bVar3 = false;
        goto LAB_0046f695;
      }
      lVar1 = lVar1 + -1;
      local_1d0.CurPoly = local_1d0.CurPoly + 1;
    } while (lVar1 != 0);
  }
  Printf("EV_MovePoly: Invalid polyobj num: %d\n");
  return false;
LAB_0046f695:
  pDVar2 = (poly->specialdata).field_0.p;
  if (pDVar2 == (DPolyAction *)0x0) {
LAB_0046f6b8:
    if (poly->bBlocked == true && !overRide) {
      return bVar3;
    }
  }
  else {
    if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (poly->specialdata).field_0.p = (DPolyAction *)0x0;
      goto LAB_0046f6b8;
    }
    if (!overRide) {
      return bVar3;
    }
  }
  pDVar2 = (DPolyAction *)
           M_Malloc_Dbg(0x70,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                        ,0x1f9);
  DPolyAction::DPolyAction(pDVar2,poly->tag);
  (pDVar2->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006fed98;
  pDVar2[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
  pDVar2[1].super_DThinker.super_DObject.Class = (PClass *)0x0;
  pDVar2[1].super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
  (poly->specialdata).field_0.p = pDVar2;
  poly->bBlocked = false;
  pDVar2->m_Dist = dist;
  pDVar2->m_Speed = speed;
  pDVar2[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)angle->Degrees;
  TAngle<double>::ToVector(&local_1e8,speed);
  pDVar2[1].super_DThinker.super_DObject.Class = (PClass *)local_1e8.Degrees;
  pDVar2[1].super_DThinker.super_DObject.ObjNext = pDStack_1e0;
  SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
  if ((dist / speed <= 2.0) &&
     (this = (pDVar2->m_Interpolation).field_0.p, this != (DInterpolation *)0x0)) {
    if (((this->super_DObject).ObjectFlags & 0x20) == 0) {
      DInterpolation::DelRef(this,false);
    }
    (pDVar2->m_Interpolation).field_0.p = (DInterpolation *)0x0;
  }
  angle->Degrees = angle->Degrees + 180.0;
  poly = FPolyMirrorIterator::NextMirror(&local_1d0);
  bVar3 = true;
  if (poly == (FPolyObj *)0x0) {
    return true;
  }
  goto LAB_0046f695;
}

Assistant:

bool EV_MovePoly (line_t *line, int polyNum, double speed, DAngle angle,
				  double dist, bool overRide)
{
	DMovePoly *pe = NULL;
	FPolyObj *poly;
	DAngle an = angle;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePoly: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePoly(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = dist; // Distance
		pe->m_Speed = speed;
		pe->m_Angle = angle;
		pe->m_Speedv = angle.ToVector(speed);
		SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);

		// Do not interpolate very fast moving polyobjects. The minimum tic count is
		// 3 instead of 2, because the moving crate effect in Massmouth 2, Hostitality
		// that this fixes isn't quite fast enough to move the crate back to its start
		// in just 1 tic.
		if (dist/speed <= 2)
		{
			pe->StopInterpolation ();
		}

		angle += 180.;	// Reverse the angle.
	}
	return pe != NULL;	// Return true if something started moving.
}